

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O2

void xmlSAX2Text(xmlParserCtxtPtr ctxt,xmlChar *ch,int len,xmlElementType type)

{
  int iVar1;
  _xmlNode *p_Var2;
  int iVar3;
  xmlChar *cur;
  xmlNodePtr pxVar4;
  long lVar5;
  char *msg;
  
  if (ctxt == (xmlParserCtxtPtr)0x0) {
    return;
  }
  if (ctxt->node == (xmlNodePtr)0x0) {
    return;
  }
  pxVar4 = ctxt->node->last;
  if (pxVar4 == (xmlNodePtr)0x0) {
    if (type == XML_TEXT_NODE) {
      pxVar4 = xmlSAX2TextNode(ctxt,ch,len);
    }
    else {
      pxVar4 = xmlNewCDataBlock(ctxt->myDoc,ch,len);
    }
    if (pxVar4 != (xmlNodePtr)0x0) {
      p_Var2 = ctxt->node;
      p_Var2->children = pxVar4;
      p_Var2->last = pxVar4;
      pxVar4->parent = p_Var2;
      pxVar4->doc = p_Var2->doc;
      goto LAB_00179502;
    }
LAB_00179641:
    msg = "xmlSAX2Characters";
LAB_00179648:
    xmlSAX2ErrMemory(ctxt,msg);
    return;
  }
  if (pxVar4->type == type) {
    if ((type != XML_TEXT_NODE) || (pxVar4->name == "text")) {
      if (ctxt->nodemem == 0) {
        iVar3 = xmlTextConcat(pxVar4,ch,len);
        if (iVar3 != 0) {
          xmlSAX2ErrMemory(ctxt,"xmlSAX2Characters");
        }
        if (ctxt->node->children == (_xmlNode *)0x0) {
          return;
        }
        iVar3 = xmlStrlen(pxVar4->content);
        ctxt->nodelen = iVar3;
        ctxt->nodemem = iVar3 + 1;
        return;
      }
      cur = pxVar4->content;
      if ((_xmlAttr **)cur == &pxVar4->properties) {
        cur = xmlStrdup(cur);
        pxVar4->content = cur;
        pxVar4->properties = (_xmlAttr *)0x0;
      }
      else if (ctxt->nodemem == ctxt->nodelen + 1) {
        iVar3 = xmlDictOwns(ctxt->dict,cur);
        cur = pxVar4->content;
        if (iVar3 != 0) {
          cur = xmlStrdup(cur);
          pxVar4->content = cur;
        }
      }
      if (cur == (xmlChar *)0x0) {
        msg = "xmlSAX2Characters: xmlStrdup returned NULL";
        goto LAB_00179648;
      }
      iVar3 = ctxt->nodelen;
      if ((int)(len ^ 0x7fffffffU) < iVar3) {
        msg = "xmlSAX2Characters overflow prevented";
        goto LAB_00179648;
      }
      if ((10000000 < iVar3 + len) && ((ctxt->options & 0x80000) == 0)) {
        msg = "xmlSAX2Characters: huge text node";
        goto LAB_00179648;
      }
      iVar1 = ctxt->nodemem;
      if (iVar3 + len < iVar1) {
LAB_0017960f:
        memcpy(cur + iVar3,ch,(long)len);
        lVar5 = (long)ctxt->nodelen + (long)len;
        ctxt->nodelen = (int)lVar5;
        pxVar4->content[lVar5] = '\0';
        return;
      }
      iVar3 = iVar1 + len;
      if ((int)(len ^ 0x7fffffffU) < iVar1) {
        iVar3 = 0x7fffffff;
      }
      iVar1 = iVar3 * 2;
      if (0x3fffffff < iVar3) {
        iVar1 = 0x7fffffff;
      }
      cur = (xmlChar *)(*xmlRealloc)(cur,(long)iVar1);
      if (cur != (xmlChar *)0x0) {
        ctxt->nodemem = iVar1;
        pxVar4->content = cur;
        iVar3 = ctxt->nodelen;
        goto LAB_0017960f;
      }
      goto LAB_00179641;
    }
LAB_0017948d:
    pxVar4 = xmlSAX2TextNode(ctxt,ch,len);
    pxVar4->doc = ctxt->myDoc;
  }
  else {
    if (type == XML_TEXT_NODE) goto LAB_0017948d;
    pxVar4 = xmlNewCDataBlock(ctxt->myDoc,ch,len);
    if (pxVar4 == (xmlNodePtr)0x0) {
      return;
    }
  }
  xmlAddChild(ctxt->node,pxVar4);
  if (ctxt->node->children == (_xmlNode *)0x0) {
    return;
  }
LAB_00179502:
  ctxt->nodelen = len;
  ctxt->nodemem = len + 1;
  return;
}

Assistant:

static void
xmlSAX2Text(xmlParserCtxtPtr ctxt, const xmlChar *ch, int len,
            xmlElementType type)
{
    xmlNodePtr lastChild;

    if (ctxt == NULL) return;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2Characters(%.30s, %d)\n", ch, len);
#endif
    /*
     * Handle the data if any. If there is no child
     * add it as content, otherwise if the last child is text,
     * concatenate it, else create a new node of type text.
     */

    if (ctxt->node == NULL) {
#ifdef DEBUG_SAX_TREE
	xmlGenericError(xmlGenericErrorContext,
		"add chars: ctxt->node == NULL !\n");
#endif
        return;
    }
    lastChild = ctxt->node->last;
#ifdef DEBUG_SAX_TREE
    xmlGenericError(xmlGenericErrorContext,
	    "add chars to %s \n", ctxt->node->name);
#endif

    /*
     * Here we needed an accelerator mechanism in case of very large
     * elements. Use an attribute in the structure !!!
     */
    if (lastChild == NULL) {
        if (type == XML_TEXT_NODE)
            lastChild = xmlSAX2TextNode(ctxt, ch, len);
        else
            lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	if (lastChild != NULL) {
	    ctxt->node->children = lastChild;
	    ctxt->node->last = lastChild;
	    lastChild->parent = ctxt->node;
	    lastChild->doc = ctxt->node->doc;
	    ctxt->nodelen = len;
	    ctxt->nodemem = len + 1;
	} else {
	    xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters");
	    return;
	}
    } else {
	int coalesceText = (lastChild != NULL) &&
	    (lastChild->type == type) &&
	    ((type != XML_TEXT_NODE) ||
             (lastChild->name == xmlStringText));
	if ((coalesceText) && (ctxt->nodemem != 0)) {
	    /*
	     * The whole point of maintaining nodelen and nodemem,
	     * xmlTextConcat is too costly, i.e. compute length,
	     * reallocate a new buffer, move data, append ch. Here
	     * We try to minimize realloc() uses and avoid copying
	     * and recomputing length over and over.
	     */
	    if (lastChild->content == (xmlChar *)&(lastChild->properties)) {
		lastChild->content = xmlStrdup(lastChild->content);
		lastChild->properties = NULL;
	    } else if ((ctxt->nodemem == ctxt->nodelen + 1) &&
	               (xmlDictOwns(ctxt->dict, lastChild->content))) {
		lastChild->content = xmlStrdup(lastChild->content);
	    }
	    if (lastChild->content == NULL) {
		xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters: xmlStrdup returned NULL");
		return;
 	    }
	    if (ctxt->nodelen > INT_MAX - len) {
                xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters overflow prevented");
                return;
	    }
            if ((ctxt->nodelen + len > XML_MAX_TEXT_LENGTH) &&
                ((ctxt->options & XML_PARSE_HUGE) == 0)) {
                xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters: huge text node");
                return;
            }
	    if (ctxt->nodelen + len >= ctxt->nodemem) {
		xmlChar *newbuf;
		int size;

		size = ctxt->nodemem > INT_MAX - len ?
                       INT_MAX :
                       ctxt->nodemem + len;
		size = size > INT_MAX / 2 ? INT_MAX : size * 2;
                newbuf = (xmlChar *) xmlRealloc(lastChild->content,size);
		if (newbuf == NULL) {
		    xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters");
		    return;
		}
		ctxt->nodemem = size;
		lastChild->content = newbuf;
	    }
	    memcpy(&lastChild->content[ctxt->nodelen], ch, len);
	    ctxt->nodelen += len;
	    lastChild->content[ctxt->nodelen] = 0;
	} else if (coalesceText) {
	    if (xmlTextConcat(lastChild, ch, len)) {
		xmlSAX2ErrMemory(ctxt, "xmlSAX2Characters");
	    }
	    if (ctxt->node->children != NULL) {
		ctxt->nodelen = xmlStrlen(lastChild->content);
		ctxt->nodemem = ctxt->nodelen + 1;
	    }
	} else {
	    /* Mixed content, first time */
            if (type == XML_TEXT_NODE) {
                lastChild = xmlSAX2TextNode(ctxt, ch, len);
                lastChild->doc = ctxt->myDoc;
            } else
                lastChild = xmlNewCDataBlock(ctxt->myDoc, ch, len);
	    if (lastChild != NULL) {
		xmlAddChild(ctxt->node, lastChild);
		if (ctxt->node->children != NULL) {
		    ctxt->nodelen = len;
		    ctxt->nodemem = len + 1;
		}
	    }
	}
    }
}